

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

void Lms_ManStop(Lms_Man_t *p)

{
  Lms_Man_t *p_local;
  
  Vec_IntFreeP(&p->vLabels);
  Vec_PtrFreeP(&p->vLabelsP);
  Vec_PtrFreeP(&p->vNodes);
  Vec_IntFreeP(&p->vTruthPo);
  Vec_WrdFreeP(&p->vDelays);
  Vec_StrFreeP(&p->vAreas);
  Vec_IntFreeP(&p->vFreqs);
  Vec_IntFreeP(&p->vTruthFreqs);
  Vec_IntFreeP(&p->vTruthIds);
  Vec_MemHashFree(p->vTtMem);
  Vec_MemFree(p->vTtMem);
  Gia_ManStopP(&p->pGia);
  if (p != (Lms_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Lms_ManStop( Lms_Man_t * p )
{
    // temporaries
    Vec_IntFreeP( &p->vLabels );
    Vec_PtrFreeP( &p->vLabelsP );
    Vec_PtrFreeP( &p->vNodes );
    // internal data for AIG level minimization
    Vec_IntFreeP( &p->vTruthPo );
    Vec_WrdFreeP( &p->vDelays );
    Vec_StrFreeP( &p->vAreas );
    Vec_IntFreeP( &p->vFreqs );
    Vec_IntFreeP( &p->vTruthFreqs );
    // internal data for library construction
    Vec_IntFreeP( &p->vTruthIds );
    Vec_MemHashFree( p->vTtMem );
//    Vec_MemHashFree( p->vTtMem2 );
    Vec_MemFree( p->vTtMem );
//    Vec_MemFree( p->vTtMem2 );
    Gia_ManStopP( &p->pGia );
    ABC_FREE( p );
}